

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_strequalnocase(char *a,char *b)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int local_2c;
  int i;
  int blen;
  int alen;
  char *b_local;
  char *a_local;
  
  iVar3 = sx_strlen(a);
  iVar4 = sx_strlen(b);
  if (iVar3 == iVar4) {
    for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
      cVar1 = sx_tolowerchar(a[local_2c]);
      cVar2 = sx_tolowerchar(b[local_2c]);
      if (cVar1 != cVar2) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool sx_strequalnocase(const char* SX_RESTRICT a, const char* SX_RESTRICT b)
{
    int alen = sx_strlen(a);
    int blen = sx_strlen(b);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (sx_tolowerchar(a[i]) != sx_tolowerchar(b[i]))
            return false;
    }
    return true;
}